

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sasl_mssbcbs.c
# Opt level: O2

int saslmssbcbs_get_init_bytes
              (CONCRETE_SASL_MECHANISM_HANDLE sasl_mechanism_concrete_handle,
              SASL_MECHANISM_BYTES *init_bytes)

{
  if (sasl_mechanism_concrete_handle != (CONCRETE_SASL_MECHANISM_HANDLE)0x0) {
    init_bytes->bytes = (void *)0x0;
    init_bytes->length = 0;
    return 0;
  }
  return 0x2d;
}

Assistant:

int saslmssbcbs_get_init_bytes(CONCRETE_SASL_MECHANISM_HANDLE sasl_mechanism_concrete_handle, SASL_MECHANISM_BYTES* init_bytes)
{
    int result;

    if (sasl_mechanism_concrete_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        init_bytes->bytes = NULL;
        init_bytes->length = 0;

        result = 0;
    }

    return result;
}